

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  uint uVar14;
  ImGuiContext *g;
  bool bVar15;
  ImVec2 IVar16;
  
  pIVar7 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  bVar15 = (flags & 7U) == 0;
  uVar5 = (uint)bVar15 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar5 = (uint)bVar15 | flags;
  }
  pIVar3 = pIVar7->HoveredWindow;
  if ((pIVar3 == (ImGuiWindow *)0x0 || (uVar5 >> 0xb & 1) == 0) ||
     (pIVar3->RootWindowDockTree != window->RootWindowDockTree)) {
    bVar15 = false;
  }
  else {
    pIVar7->HoveredWindow = window;
    bVar15 = true;
  }
  bVar8 = ItemHoverable(bb,id);
  if (bVar8) {
    bVar8 = true;
    if (((pIVar7->DragDropActive & 1U) != 0) && ((pIVar7->DragDropPayload).SourceId == id)) {
      bVar8 = (bool)(((byte)pIVar7->DragDropSourceFlags & 2) >> 1);
    }
  }
  else {
    bVar8 = false;
  }
  if (((uVar5 >> 9 & 1) == 0 || (~pIVar7->DragDropActive & 1U) != 0) ||
     ((pIVar7->DragDropSourceFlags & 4) != 0)) {
    bVar9 = false;
  }
  else {
    bVar9 = IsItemHovered(0x80);
    if (bVar9) {
      SetHoveredID(id);
      bVar9 = false;
      bVar8 = true;
      if (0.7 <= pIVar7->HoveredIdTimer) {
        if (pIVar7->HoveredIdTimer - (pIVar7->IO).DeltaTime <= 0.7) {
          pIVar7->DragDropHoldJustPressedId = id;
          FocusWindow(window);
          bVar8 = true;
          bVar9 = true;
        }
        goto LAB_001824db;
      }
    }
    bVar9 = false;
  }
LAB_001824db:
  if (bVar15) {
    pIVar7->HoveredWindow = pIVar3;
  }
  if (bVar8 == true && (uVar5 >> 0xc & 1) != 0) {
    bVar8 = pIVar7->HoveredIdPreviousFrame == 0 || pIVar7->HoveredIdPreviousFrame == id;
  }
  if (bVar8 == false) {
    bVar15 = false;
  }
  else {
    if (((uVar5 >> 0x10 & 1) == 0) ||
       ((((pIVar7->IO).KeyCtrl == false && ((pIVar7->IO).KeyShift == false)) &&
        ((pIVar7->IO).KeyAlt == false)))) {
      if ((uVar5 & 1) == 0) {
LAB_0018253a:
        if (((uVar5 & 2) == 0) || ((pIVar7->IO).MouseClicked[1] == false)) {
          if ((uVar5 & 4) == 0) {
            uVar14 = 0xffffffff;
            bVar10 = 1;
          }
          else {
            bVar10 = (pIVar7->IO).MouseClicked[2] ^ 1;
            uVar14 = -(uint)bVar10 | 2;
          }
        }
        else {
          bVar10 = 0;
          uVar14 = 1;
        }
        if ((uVar5 & 1) != 0) goto LAB_001825c5;
LAB_001825da:
        if (((uVar5 & 2) == 0) || ((pIVar7->IO).MouseReleased[1] == false)) {
          lVar13 = 0xffffffff;
          if ((uVar5 & 4) == 0) {
            cVar12 = '\0';
          }
          else {
            cVar12 = (pIVar7->IO).MouseReleased[2];
            if ((bool)cVar12 != false) {
              lVar13 = 2;
            }
          }
        }
        else {
          cVar12 = '\x01';
          lVar13 = 1;
        }
      }
      else {
        uVar14 = 0;
        bVar10 = 0;
        if ((pIVar7->IO).MouseClicked[0] == false) goto LAB_0018253a;
LAB_001825c5:
        if ((pIVar7->IO).MouseReleased[0] == false) goto LAB_001825da;
        cVar12 = '\x01';
        lVar13 = 0;
      }
      if ((bVar10 == 0) && (pIVar7->ActiveId != id)) {
        if ((uVar5 & 0x60) != 0) {
          SetActiveID(id,window);
          pIVar7->ActiveIdMouseButton = uVar14;
          if ((uVar5 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar5 & 0x10) != 0) ||
           (((uVar5 >> 8 & 1) != 0 && ((pIVar7->IO).MouseClickedCount[uVar14] == 2)))) {
          if ((uVar5 >> 0x11 & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          if ((uVar5 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          pIVar7->ActiveIdMouseButton = uVar14;
          FocusWindow(window);
          bVar9 = true;
        }
      }
      if (((char)(byte)uVar5 < '\0') && (cVar12 != '\0')) {
        bVar15 = true;
        if (((uVar5 >> 10 & 1) != 0) &&
           (bVar15 = bVar9, (pIVar7->IO).MouseDownDurationPrev[lVar13] < (pIVar7->IO).KeyRepeatDelay
           )) {
          bVar15 = true;
        }
        if ((uVar5 >> 0x12 & 1) == 0) {
          SetFocusID(id,window);
        }
        ClearActiveID();
        bVar9 = bVar15;
      }
      if (((((uVar5 >> 10 & 1) != 0) && (pIVar7->ActiveId == id)) &&
          (0.0 < (pIVar7->IO).MouseDownDuration[pIVar7->ActiveIdMouseButton])) &&
         (bVar15 = IsMouseClicked(pIVar7->ActiveIdMouseButton,true), bVar15)) {
        bVar9 = true;
      }
    }
    bVar15 = true;
    if (bVar9) {
      pIVar7->NavDisableHighlight = true;
    }
  }
  if (((pIVar7->NavId == id) && (pIVar7->NavDisableHighlight == false)) &&
     (pIVar7->NavDisableMouseHover == true)) {
    IVar2 = pIVar7->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar5 >> 0x13 & 1) == 0) {
LAB_001827ad:
        bVar15 = true;
      }
    }
    else if (((uVar5 >> 0x13 & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_001827ad;
  }
  if ((pIVar7->NavActivateDownId == id) &&
     ((IVar2 = pIVar7->NavActivateId,
      bVar8 = IsNavInputTest(0,(uVar5 >> 9 & 2) + ImGuiInputReadMode_Pressed), IVar2 == id ||
      (bVar8)))) {
    SetActiveID(id,window);
    pIVar7->ActiveIdSource = ImGuiInputSource_Nav;
    if ((uVar5 >> 0x12 & 1) == 0) {
      SetFocusID(id,window);
    }
    bVar9 = true;
  }
  if (pIVar7->ActiveId != id) {
    bVar8 = false;
    goto LAB_00182937;
  }
  if (pIVar7->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar7->NavActivateDownId != id) {
      ClearActiveID();
    }
LAB_0018289e:
    bVar8 = false;
  }
  else {
    if (pIVar7->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0018289e;
    if (pIVar7->ActiveIdIsJustActivated == true) {
      IVar1 = (pIVar7->IO).MousePos;
      IVar16.x = IVar1.x - (bb->Min).x;
      IVar16.y = IVar1.y - (bb->Min).y;
      pIVar7->ActiveIdClickOffset = IVar16;
    }
    uVar11 = (ulong)(uint)pIVar7->ActiveIdMouseButton;
    if (4 < uVar11) {
      __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x279,
                    "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                   );
    }
    bVar8 = true;
    if ((pIVar7->IO).MouseDown[uVar11] == false) {
      bVar6 = bVar9;
      if ((((uVar5 & 0x40) != 0) || (((byte)uVar5 >> 5 & bVar15) != 0)) &&
         (pIVar7->DragDropActive == false)) {
        if (((uVar5 >> 8 & 1) == 0) || ((pIVar7->IO).MouseReleased[uVar11] != true)) {
          bVar8 = false;
        }
        else {
          bVar8 = (pIVar7->IO).MouseClickedLastCount[uVar11] == 2;
        }
        if ((uVar5 >> 10 & 1) == 0) {
          bVar4 = false;
        }
        else {
          bVar4 = (pIVar7->IO).KeyRepeatDelay <= (pIVar7->IO).MouseDownDurationPrev[uVar11];
        }
        if ((!bVar8) && (bVar6 = true, bVar4)) {
          bVar6 = bVar9;
        }
      }
      ClearActiveID();
      bVar8 = false;
      bVar9 = bVar6;
    }
    if ((uVar5 >> 0x12 & 1) == 0) {
      pIVar7->NavDisableHighlight = true;
    }
  }
  if (bVar9 != false) {
    pIVar7->ActiveIdHasBeenPressedBefore = true;
  }
LAB_00182937:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar15;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar8;
  }
  return bVar9;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindowDockTree == window->RootWindowDockTree;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}